

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCut.c
# Opt level: O0

void Ivy_ManTestCutsAll(Ivy_Man_t *p)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Ivy_Obj_t *pObj_00;
  Ivy_Store_t *pIVar4;
  abctime aVar5;
  abctime clk;
  uint local_28;
  int nNodeOver;
  int nNodeTotal;
  int nCutsTotal;
  int nCutsCut;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Man_t *p_local;
  
  aVar3 = Abc_Clock();
  clk._4_4_ = 0;
  local_28 = 0;
  iVar1 = Ivy_ManNodeNum(p);
  nNodeOver = -iVar1;
  for (nCutsTotal = 0; iVar1 = Vec_PtrSize(p->vObjs), nCutsTotal < iVar1;
      nCutsTotal = nCutsTotal + 1) {
    pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,nCutsTotal);
    if ((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsNode(pObj_00), iVar1 != 0)) {
      pIVar4 = Ivy_NodeFindCutsAll(p,pObj_00,5);
      nNodeOver = pIVar4->nCuts + nNodeOver;
      clk._4_4_ = (pIVar4->nCuts == 0x100) + clk._4_4_;
      local_28 = local_28 + 1;
    }
  }
  iVar1 = Ivy_ManPiNum(p);
  iVar2 = Ivy_ManNodeNum(p);
  printf("Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ",(ulong)(uint)nNodeOver,
         (ulong)(uint)(iVar1 + iVar2),(ulong)local_28,(ulong)clk._4_4_);
  Abc_Print(1,"%s =","Time");
  aVar5 = Abc_Clock();
  Abc_Print(1,"%9.2f sec\n",((double)(aVar5 - aVar3) * 1.0) / 1000000.0);
  return;
}

Assistant:

void Ivy_ManTestCutsAll( Ivy_Man_t * p )
{
    Ivy_Obj_t * pObj;
    int i, nCutsCut, nCutsTotal, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        nCutsCut    = Ivy_NodeFindCutsAll( p, pObj, 5 )->nCuts;
        nCutsTotal += nCutsCut;
        nNodeOver  += (nCutsCut == IVY_CUT_LIMIT);
        nNodeTotal++;
    }
    printf( "Total cuts = %6d. Trivial = %6d.   Nodes = %6d. Satur = %6d.  ", 
        nCutsTotal, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}